

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

CodeGeneratorResponse * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::New(CodeGeneratorResponse *this,Arena *arena)

{
  CodeGeneratorResponse *this_00;
  
  this_00 = (CodeGeneratorResponse *)operator_new(0x38);
  CodeGeneratorResponse(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::compiler::CodeGeneratorResponse>(arena,this_00);
  }
  return this_00;
}

Assistant:

CodeGeneratorResponse* CodeGeneratorResponse::New(::google::protobuf::Arena* arena) const {
  CodeGeneratorResponse* n = new CodeGeneratorResponse;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}